

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

void gnuplotio::
     handle_colunwrap_tag<1ul,std::pair<std::array<int,3ul>&,boost::array<int,3ul>&>,gnuplotio::ModeBinary>
               (undefined8 stream,pair<std::array<int,_3UL>_&,_boost::array<int,_3UL>_&> *arg)

{
  undefined1 local_40 [8];
  range_type range;
  pair<std::array<int,_3UL>_&,_boost::array<int,_3UL>_&> *arg_local;
  ostream *stream_local;
  
  range.r.end = (int *)arg;
  ArrayTraitsImpl<std::pair<std::array<int,_3UL>_&,_boost::array<int,_3UL>_&>,_void>::get_range
            ((range_type *)local_40,arg);
  print_block<1ul,gnuplotio::PairOfRange<gnuplotio::IteratorRange<int_const*,int>,gnuplotio::IteratorRange<int_const*,int>>,gnuplotio::ModeBinary>
            (stream,local_40);
  return;
}

Assistant:

void handle_colunwrap_tag(std::ostream &stream, const T &arg, ColUnwrapNo, PrintMode) {
    static_assert(ArrayTraits<T>::depth >= Depth, "container not deep enough");
    typename ArrayTraits<T>::range_type range = ArrayTraits<T>::get_range(arg);
    print_block<Depth>(stream, range, PrintMode());
}